

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall BaseSocketImpl::SetSocketOption(BaseSocketImpl *this,int32_t *fd)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  SOCKOPT rc;
  undefined4 local_c;
  
  local_c = 1;
  iVar1 = setsockopt(*fd,1,2,&local_c,4);
  if (iVar1 == 0) {
    iVar1 = fcntl(*fd,2,1);
    if (iVar1 != -1) {
      iVar1 = *fd;
      uVar2 = fcntl(iVar1,3);
      iVar1 = fcntl(iVar1,4,(ulong)(uVar2 | 0x800));
      if (iVar1 != -1) {
        return;
      }
    }
  }
  piVar3 = (int *)__cxa_allocate_exception(4);
  piVar4 = __errno_location();
  *piVar3 = *piVar4;
  __cxa_throw(piVar3,&int::typeinfo,0);
}

Assistant:

void BaseSocketImpl::SetSocketOption(const SOCKET& fd)
{
    constexpr SOCKOPT rc = 1;
    if (::setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &rc, sizeof(rc)) != 0)
        throw WSAGetLastError();
#if defined(_WIN32) || defined(_WIN64)
    unsigned long rl = 1;
    if (::ioctlsocket(fd, FIONBIO, &rl) == SOCKET_ERROR)  /* 1 for non-block, 0 for block */
        throw WSAGetLastError();
#else
    if (fcntl(fd, F_SETFD, FD_CLOEXEC) == -1)
        throw errno;
    if (fcntl(fd, F_SETFL, fcntl(fd, F_GETFL) | O_NONBLOCK) == -1)
        throw errno;
#endif
}